

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void anon_unknown.dwarf_ac7333::CreateGeneratedSource
               (cmLocalGenerator *lg,string *output,OutputRole role,cmCommandOrigin origin,
               cmListFileBacktrace *lfbt)

{
  cmake *pcVar1;
  bool bVar2;
  size_type sVar3;
  long lVar4;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string local_e0;
  string local_c0;
  string local_88;
  char *local_68;
  undefined8 local_60;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  
  sVar3 = cmGeneratorExpression::Find(output);
  if (sVar3 == 0xffffffffffffffff) {
    bVar2 = cmMakefile::CanIWriteThisFile(lg->Makefile,output);
    if (bVar2) {
      lVar4 = std::__cxx11::string::find_first_of((char *)output,0x88fe8d,0);
      if (lVar4 == -1) {
        if (origin != Generator) {
          return;
        }
        cmMakefile::GetOrCreateGeneratedSource(lg->Makefile,output);
        return;
      }
      pcVar1 = lg->GlobalGenerator->CMakeInstance;
      local_88._M_dataplus._M_p = (pointer)((ulong)(role != Primary) * 4 + 6);
      local_88._M_string_length = 0x88fea3;
      if (role == Primary) {
        local_88._M_string_length = 0x875c24;
      }
      local_88.field_2._M_allocated_capacity = 0;
      local_88.field_2._8_8_ = 0xf;
      local_68 = " containing a \"";
      local_60 = 0;
      local_c0.field_2._M_local_buf[8] = (output->_M_dataplus)._M_p[lVar4];
      local_c0.field_2._M_allocated_capacity = (long)&local_c0.field_2 + 8;
      local_c0._M_dataplus._M_p = (pointer)0x0;
      local_c0._M_string_length = 1;
      local_58 = 1;
      local_48 = 0;
      local_40 = 0x11;
      local_38 = "\" is not allowed.";
      local_30 = 0;
      views._M_len = 4;
      views._M_array = (iterator)&local_88;
      local_50 = (pointer)local_c0.field_2._M_allocated_capacity;
      cmCatViews(&local_e0,views);
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_e0,lfbt);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
        return;
      }
    }
    else {
      pcVar1 = lg->GlobalGenerator->CMakeInstance;
      local_88._M_dataplus._M_p = (pointer)((ulong)(role != Primary) * 4 + 6);
      local_88._M_string_length = 0x88fea3;
      if (role == Primary) {
        local_88._M_string_length = 0x875c24;
      }
      local_88.field_2._M_allocated_capacity = 0;
      local_88.field_2._8_8_ = 8;
      local_68 = " path\n  ";
      local_60 = 0;
      local_50 = (output->_M_dataplus)._M_p;
      local_58 = output->_M_string_length;
      local_48 = 0;
      local_40 = 0x36;
      local_38 = "\nin a source directory as an output of custom command.";
      local_30 = 0;
      views_00._M_len = 4;
      views_00._M_array = (iterator)&local_88;
      cmCatViews(&local_c0,views_00);
      cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_c0,lfbt);
      local_e0.field_2._M_allocated_capacity = local_c0.field_2._M_allocated_capacity;
      local_e0._M_dataplus._M_p = local_c0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p == &local_c0.field_2) {
        return;
      }
    }
  }
  else {
    pcVar1 = lg->GlobalGenerator->CMakeInstance;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "Generator expressions in custom command outputs are not implemented!","");
    cmake::IssueMessage(pcVar1,FATAL_ERROR,&local_88,lfbt);
    local_e0.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
    local_e0._M_dataplus._M_p = local_88._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == &local_88.field_2) {
      return;
    }
  }
  operator_delete(local_e0._M_dataplus._M_p,(ulong)(local_e0.field_2._M_allocated_capacity + 1));
  return;
}

Assistant:

void CreateGeneratedSource(cmLocalGenerator& lg, const std::string& output,
                           cmLocalGenerator::OutputRole role,
                           cmCommandOrigin origin,
                           const cmListFileBacktrace& lfbt)
{
  if (cmGeneratorExpression::Find(output) != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "Generator expressions in custom command outputs are not implemented!",
      lfbt);
    return;
  }

  // Make sure the file will not be generated into the source
  // directory during an out of source build.
  if (!lg.GetMakefile()->CanIWriteThisFile(output)) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " path\n  ", output,
               "\nin a source directory as an output of custom command."),
      lfbt);
    return;
  }

  // Make sure the output file name has no invalid characters.
  std::string::size_type pos = output.find_first_of("#<>");
  if (pos != std::string::npos) {
    lg.GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(CustomOutputRoleKeyword(role), " containing a \"", output[pos],
               "\" is not allowed."),
      lfbt);
    return;
  }

  // Outputs without generator expressions from the project are already
  // created and marked as generated.  Do not mark them again, because
  // other commands might have overwritten the property.
  if (origin == cmCommandOrigin::Generator) {
    lg.GetMakefile()->GetOrCreateGeneratedSource(output);
  }
}